

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterHashInit(Fts5Index *p,u8 *pTerm,int nTerm,int flags,Fts5SegIter *pIter)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int local_54;
  u8 *local_50;
  u8 *pList;
  Fts5Data *pLeaf;
  u8 *puStack_38;
  int n;
  u8 *z;
  Fts5SegIter *pFStack_28;
  int nList;
  Fts5SegIter *pIter_local;
  int flags_local;
  int nTerm_local;
  u8 *pTerm_local;
  Fts5Index *p_local;
  
  z._4_4_ = 0;
  puStack_38 = (u8 *)0x0;
  pLeaf._4_4_ = 0;
  pList = (u8 *)0x0;
  pFStack_28 = pIter;
  pIter_local._0_4_ = flags;
  pIter_local._4_4_ = nTerm;
  _flags_local = pTerm;
  pTerm_local = (u8 *)p;
  if ((pTerm == (u8 *)0x0) || ((flags & 8U) != 0)) {
    local_50 = (u8 *)0x0;
    iVar2 = sqlite3Fts5HashScanInit(p->pHash,(char *)pTerm,nTerm);
    *(int *)(pTerm_local + 0x34) = iVar2;
    sqlite3Fts5HashScanEntry
              (*(Fts5Hash **)(pTerm_local + 0x18),(char **)&stack0xffffffffffffffc8,&local_50,
               (int *)((long)&z + 4));
    if (puStack_38 == (u8 *)0x0) {
      local_54 = 0;
    }
    else {
      sVar3 = strlen((char *)puStack_38);
      local_54 = (int)sVar3;
    }
    pLeaf._4_4_ = local_54;
    if ((local_50 != (u8 *)0x0) &&
       (pList = (u8 *)fts5IdxMalloc((Fts5Index *)pTerm_local,0x10), (long *)pList != (long *)0x0)) {
      *(u8 **)pList = local_50;
    }
  }
  else {
    iVar2 = sqlite3Fts5HashQuery(p->pHash,0x10,(char *)pTerm,nTerm,&pList,(int *)((long)&z + 4));
    *(int *)(pTerm_local + 0x34) = iVar2;
    if (pList != (u8 *)0x0) {
      *(u8 **)pList = pList + 0x10;
    }
    puStack_38 = _flags_local;
    pLeaf._4_4_ = pIter_local._4_4_;
    pFStack_28->flags = pFStack_28->flags | 1;
  }
  if (pList != (u8 *)0x0) {
    sqlite3Fts5BufferSet((int *)(pTerm_local + 0x34),&pFStack_28->term,pLeaf._4_4_,puStack_38);
    *(undefined4 *)(pList + 0xc) = z._4_4_;
    *(undefined4 *)(pList + 8) = z._4_4_;
    pFStack_28->pLeaf = (Fts5Data *)pList;
    bVar1 = sqlite3Fts5GetVarint(*(uchar **)pList,(u64 *)&pFStack_28->iRowid);
    pFStack_28->iLeafOffset = (uint)bVar1;
    pFStack_28->iEndofDoclist = *(int *)(pList + 8);
    if (((uint)pIter_local & 2) == 0) {
      fts5SegIterLoadNPos((Fts5Index *)pTerm_local,pFStack_28);
    }
    else {
      pFStack_28->flags = pFStack_28->flags | 2;
      fts5SegIterReverseInitPage((Fts5Index *)pTerm_local,pFStack_28);
    }
  }
  fts5SegIterSetNext((Fts5Index *)pTerm_local,pFStack_28);
  return;
}

Assistant:

static void fts5SegIterHashInit(
  Fts5Index *p,                   /* FTS5 backend */
  const u8 *pTerm, int nTerm,     /* Term to seek to */
  int flags,                      /* Mask of FTS5INDEX_XXX flags */
  Fts5SegIter *pIter              /* Object to populate */
){
  int nList = 0;
  const u8 *z = 0;
  int n = 0;
  Fts5Data *pLeaf = 0;

  assert( p->pHash );
  assert( p->rc==SQLITE_OK );

  if( pTerm==0 || (flags & FTS5INDEX_QUERY_SCAN) ){
    const u8 *pList = 0;

    p->rc = sqlite3Fts5HashScanInit(p->pHash, (const char*)pTerm, nTerm);
    sqlite3Fts5HashScanEntry(p->pHash, (const char**)&z, &pList, &nList);
    n = (z ? (int)strlen((const char*)z) : 0);
    if( pList ){
      pLeaf = fts5IdxMalloc(p, sizeof(Fts5Data));
      if( pLeaf ){
        pLeaf->p = (u8*)pList;
      }
    }
  }else{
    p->rc = sqlite3Fts5HashQuery(p->pHash, sizeof(Fts5Data), 
        (const char*)pTerm, nTerm, (void**)&pLeaf, &nList
    );
    if( pLeaf ){
      pLeaf->p = (u8*)&pLeaf[1];
    }
    z = pTerm;
    n = nTerm;
    pIter->flags |= FTS5_SEGITER_ONETERM;
  }

  if( pLeaf ){
    sqlite3Fts5BufferSet(&p->rc, &pIter->term, n, z);
    pLeaf->nn = pLeaf->szLeaf = nList;
    pIter->pLeaf = pLeaf;
    pIter->iLeafOffset = fts5GetVarint(pLeaf->p, (u64*)&pIter->iRowid);
    pIter->iEndofDoclist = pLeaf->nn;

    if( flags & FTS5INDEX_QUERY_DESC ){
      pIter->flags |= FTS5_SEGITER_REVERSE;
      fts5SegIterReverseInitPage(p, pIter);
    }else{
      fts5SegIterLoadNPos(p, pIter);
    }
  }

  fts5SegIterSetNext(p, pIter);
}